

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modulator.cpp
# Opt level: O2

EffectState * __thiscall
anon_unknown.dwarf_16a838::ModulatorStateFactory::create(ModulatorStateFactory *this)

{
  EffectState *pEVar1;
  undefined8 *puVar2;
  long lVar3;
  
  pEVar1 = (EffectState *)al_malloc(8,0x9f0);
  if (pEVar1 != (EffectState *)0x0) {
    memset(&pEVar1->super_intrusive_ref<EffectState>,0,0x9e8);
    (pEVar1->super_intrusive_ref<EffectState>).mRef.super___atomic_base<unsigned_int>._M_i = 1;
    (pEVar1->mOutTarget).mData = (pointer)0x0;
    (pEVar1->mOutTarget).mDataEnd = (pointer)0x0;
    pEVar1->_vptr_EffectState = (_func_int **)&PTR__EffectState_001abc60;
    *(undefined8 *)&pEVar1[1].super_intrusive_ref<EffectState> = 0x100000000;
    lVar3 = 0x3c;
    do {
      *(undefined8 *)((long)pEVar1 + lVar3 + -0xc) = 0;
      *(undefined4 *)((long)pEVar1 + lVar3 + -4) = 0x3f800000;
      memset((void *)((long)&pEVar1->_vptr_EffectState + lVar3),0,0x90);
      lVar3 = lVar3 + 0x9c;
    } while (lVar3 != 0x9fc);
    return pEVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = pthread_once;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EffectState *create() override { return new ModulatorState{}; }